

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zg-ndfs.cc
# Opt level: O0

tuple<tchecker::algorithms::ndfs::stats_t,_std::shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t>_>
* tchecker::tck_liveness::zg_ndfs::run
            (tuple<tchecker::algorithms::ndfs::stats_t,_std::shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t>_>
             *__return_storage_ptr__,system_declaration_t *sysdecl,string *labels,size_t block_size,
            size_t table_size)

{
  bool bVar1;
  system_t *this;
  element_type *peVar2;
  system_t *system_00;
  ostream *poVar3;
  zg_t *__p;
  graph_t *this_00;
  system_t *this_01;
  element_type *ts;
  element_type *graph_00;
  undefined1 local_d8 [8];
  stats_t stats;
  undefined1 local_90 [7];
  algorithm_t algorithm;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> accepting_labels;
  shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t> graph;
  shared_ptr<tchecker::zg::zg_t> zg;
  undefined1 local_40 [8];
  shared_ptr<const_tchecker::ta::system_t> system;
  size_t table_size_local;
  size_t block_size_local;
  string *labels_local;
  system_declaration_t *sysdecl_local;
  
  system.super___shared_ptr<const_tchecker::ta::system_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)table_size;
  this = (system_t *)operator_new(0x480);
  ta::system_t::system_t(this,sysdecl);
  std::shared_ptr<tchecker::ta::system_t_const>::shared_ptr<tchecker::ta::system_t,void>
            ((shared_ptr<tchecker::ta::system_t_const> *)local_40,this);
  peVar2 = std::
           __shared_ptr_access<const_tchecker::ta::system_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_tchecker::ta::system_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_40);
  system_00 = syncprod::system_t::as_system_system(&peVar2->super_system_t);
  bVar1 = tchecker::system::every_process_has_initial_location(system_00);
  if (!bVar1) {
    poVar3 = tchecker::operator<<((ostream *)&std::cerr,(log_warning_t *)&log_warning);
    poVar3 = std::operator<<(poVar3,"system has no initial state");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  __p = tchecker::zg::factory
                  ((shared_ptr<const_tchecker::ta::system_t> *)local_40,SHARING,ELAPSED_SEMANTICS,
                   EXTRA_LU_PLUS_LOCAL,block_size,
                   (size_t)system.
                           super___shared_ptr<const_tchecker::ta::system_t,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi);
  std::shared_ptr<tchecker::zg::zg_t>::shared_ptr<tchecker::zg::zg_t,void>
            ((shared_ptr<tchecker::zg::zg_t> *)
             &graph.
              super___shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,__p);
  this_00 = (graph_t *)operator_new(0x118);
  graph_t::graph_t(this_00,(shared_ptr<tchecker::zg::zg_t> *)
                           &graph.
                            super___shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount,block_size,
                   (size_t)system.
                           super___shared_ptr<const_tchecker::ta::system_t,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi);
  std::shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t>::
  shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t,void>
            ((shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t> *)&accepting_labels.m_num_bits,
             this_00);
  peVar2 = std::
           __shared_ptr_access<const_tchecker::ta::system_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_tchecker::ta::system_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_40);
  this_01 = ta::system_t::as_syncprod_system(peVar2);
  syncprod::system_t::labels
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_90,this_01,
             labels);
  ts = std::__shared_ptr_access<tchecker::zg::zg_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
       operator*((__shared_ptr_access<tchecker::zg::zg_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&graph.
                     super___shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount);
  graph_00 = std::
             __shared_ptr_access<tchecker::tck_liveness::zg_ndfs::graph_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<tchecker::tck_liveness::zg_ndfs::graph_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&accepting_labels.m_num_bits);
  algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::run
            ((stats_t *)local_d8,
             (algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t> *)
             &stats.field_0x3f,ts,graph_00,
             (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_90);
  std::
  make_tuple<tchecker::algorithms::ndfs::stats_t&,std::shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t>&>
            (__return_storage_ptr__,(stats_t *)local_d8,
             (shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t> *)&accepting_labels.m_num_bits);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_90);
  std::shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t>::~shared_ptr
            ((shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t> *)&accepting_labels.m_num_bits);
  std::shared_ptr<tchecker::zg::zg_t>::~shared_ptr
            ((shared_ptr<tchecker::zg::zg_t> *)
             &graph.
              super___shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::shared_ptr<const_tchecker::ta::system_t>::~shared_ptr
            ((shared_ptr<const_tchecker::ta::system_t> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::tuple<tchecker::algorithms::ndfs::stats_t, std::shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t>>
run(tchecker::parsing::system_declaration_t const & sysdecl, std::string const & labels, std::size_t block_size,
    std::size_t table_size)
{
  std::shared_ptr<tchecker::ta::system_t const> system{new tchecker::ta::system_t{sysdecl}};
  if (!tchecker::system::every_process_has_initial_location(system->as_system_system()))
    std::cerr << tchecker::log_warning << "system has no initial state" << std::endl;

  std::shared_ptr<tchecker::zg::zg_t> zg{tchecker::zg::factory(system, tchecker::ts::SHARING, tchecker::zg::ELAPSED_SEMANTICS,
                                                               tchecker::zg::EXTRA_LU_PLUS_LOCAL, block_size, table_size)};

  std::shared_ptr<tchecker::tck_liveness::zg_ndfs::graph_t> graph{
      new tchecker::tck_liveness::zg_ndfs::graph_t{zg, block_size, table_size}};

  boost::dynamic_bitset<> accepting_labels = system->as_syncprod_system().labels(labels);

  tchecker::tck_liveness::zg_ndfs::algorithm_t algorithm;

  tchecker::algorithms::ndfs::stats_t stats = algorithm.run(*zg, *graph, accepting_labels);

  return std::make_tuple(stats, graph);
}